

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::CreateAndSetGlobalGenerator(cmake *this,string *name,bool allowArch)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string vsError;
  string kdevError;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_100;
  undefined1 local_f8 [48];
  char *local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  _Alloc_hider local_78;
  pointer local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  CreateGlobalGenerator((cmake *)local_f8,(string *)this,SUB81(name,0));
  uVar1 = local_f8._0_8_;
  if ((cmGlobalGenerator *)local_f8._0_8_ == (cmGlobalGenerator *)0x0) {
    local_c8 = (char *)0x0;
    local_c0[0] = _S_red;
    local_f8._16_8_ = (pointer)0x0;
    local_f8[0x18] = 0;
    local_f8._8_8_ = (pointer)(local_f8 + 0x18);
    local_f8._40_8_ = local_c0;
    lVar3 = std::__cxx11::string::find((char *)name,0x94a8f2,0);
    if (lVar3 != -1) {
      std::__cxx11::string::_M_replace((ulong)(local_f8 + 0x28),0,local_c8,0x94a8fc);
    }
    if (!allowArch) {
      local_90.first._M_str = (name->_M_dataplus)._M_p;
      local_90.first._M_len = name->_M_string_length;
      __str._M_str = "Visual Studio ";
      __str._M_len = 0xe;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_90.first,0,0xe,__str);
      if ((iVar2 == 0) && (0x15 < name->_M_string_length)) {
        std::__cxx11::string::_M_replace((ulong)(local_f8 + 8),0,(char *)local_f8._16_8_,0x94a93e);
      }
    }
    local_90.first._M_len = 0x21;
    local_90.first._M_str = "Could not create named generator ";
    local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_70 = (name->_M_dataplus)._M_p;
    local_78._M_p = (pointer)name->_M_string_length;
    local_68._M_allocated_capacity = 0;
    local_68._8_8_ = local_c8;
    local_58._M_p = (pointer)local_f8._40_8_;
    local_50 = 0;
    local_48._M_allocated_capacity = local_f8._16_8_;
    local_48._8_8_ = local_f8._8_8_;
    local_38._0_1_ = false;
    local_38._1_1_ = false;
    local_38._2_1_ = false;
    local_38._3_5_ = 0;
    views._M_len = 4;
    views._M_array = &local_90;
    cmCatViews((string *)local_b0,views);
    cmSystemTools::Error((string *)local_b0);
    if ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    PrintGeneratorList(this);
    if ((pointer)local_f8._8_8_ != (pointer)(local_f8 + 0x18)) {
      operator_delete((void *)local_f8._8_8_,CONCAT71(local_f8._25_7_,local_f8[0x18]) + 1);
    }
    if ((undefined1 *)local_f8._40_8_ != local_c0) {
      operator_delete((void *)local_f8._40_8_,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
    }
  }
  else {
    local_100._M_head_impl = (cmGlobalGenerator *)local_f8._0_8_;
    local_f8._0_8_ = (cmGlobalGenerator *)0x0;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_100);
    if (local_100._M_head_impl != (cmGlobalGenerator *)0x0) {
      (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                   *)&(local_100._M_head_impl)->_vptr_cmGlobalGenerator)->
                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                )._M_t.
                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                _vptr_cmGlobalGeneratorFactory)();
    }
    local_100._M_head_impl = (cmGlobalGenerator *)0x0;
  }
  if ((cmGlobalGenerator *)local_f8._0_8_ != (cmGlobalGenerator *)0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_f8._0_8_)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  return (cmGlobalGenerator *)uVar1 != (cmGlobalGenerator *)0x0;
}

Assistant:

bool cmake::CreateAndSetGlobalGenerator(const std::string& name,
                                        bool allowArch)
{
  auto gen = this->CreateGlobalGenerator(name, allowArch);
  if (!gen) {
    std::string kdevError;
    std::string vsError;
    if (name.find("KDevelop3", 0) != std::string::npos) {
      kdevError = "\nThe KDevelop3 generator is not supported anymore.";
    }
    if (!allowArch && cmHasLiteralPrefix(name, "Visual Studio ") &&
        name.length() >= cmStrLen("Visual Studio xx xxxx ")) {
      vsError = "\nUsing platforms in Visual Studio generator names is not "
                "supported in CMakePresets.json.";
    }

    cmSystemTools::Error(
      cmStrCat("Could not create named generator ", name, kdevError, vsError));
    this->PrintGeneratorList();
    return false;
  }

  this->SetGlobalGenerator(std::move(gen));
  return true;
}